

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

HFSubConsumer * __thiscall
MlmWrap::createConsumerSub(MlmWrap *this,HighFreqDataType *dt,size_t messageBufferLength)

{
  SubType SVar1;
  HFSubConsumer *this_00;
  HighFreqDataType HStack_298;
  HFSubSockSettings local_208;
  HFSubSockSettings local_160;
  HighFreqDataType local_b8;
  
  this_00 = (HFSubConsumer *)operator_new(0x3c8);
  HighFreqDataType::HighFreqDataType(&HStack_298,dt);
  HFSubConsumer::HFSubConsumer
            (this_00,&HStack_298,messageBufferLength,default_consumer_queue_filter);
  HighFreqDataType::~HighFreqDataType(&HStack_298);
  addSubToList(this,(HighFreqSub *)this_00);
  HighFreqDataType::HighFreqDataType(&local_b8,dt);
  SVar1 = (this_00->super_HighFreqSub).sockType;
  HighFreqDataType::HighFreqDataType(&local_160.dataType,&local_b8);
  local_160.userFoo = (hfs_data_callback_fn)0x0;
  local_160.args = (void *)0x0;
  local_160.subSockType = SVar1;
  HighFreqDataType::~HighFreqDataType(&local_b8);
  HFSubSockSettings::HFSubSockSettings(&local_208,&local_160);
  addHfTypeToSubbedList(this,&local_208);
  HighFreqDataType::~HighFreqDataType(&local_208.dataType);
  HighFreqDataType::~HighFreqDataType(&local_160.dataType);
  return this_00;
}

Assistant:

HFSubConsumer* MlmWrap::createConsumerSub(HighFreqDataType dt, size_t messageBufferLength){
//    std::cout << "creating subscriber \n";
    HFSubConsumer *newSub = new HFSubConsumer(dt, messageBufferLength);
    addSubToList(newSub);

    HFSubSockSettings sockInfo(dt, newSub->getSubSockType(), NULL, NULL);
    addHfTypeToSubbedList(sockInfo);
    //todo: add a check to see if newSub was created properly, if not, don't add the type to the subbedList

    return newSub;
}